

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O0

VertexPacket * __thiscall rr::VertexPacketAllocator::alloc(VertexPacketAllocator *this)

{
  bool bVar1;
  __normal_iterator<rr::VertexPacket_**,_std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>_>
  *this_00;
  reference ppVVar2;
  __normal_iterator<rr::VertexPacket_**,_std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>_>
  local_40;
  VertexPacket *local_38;
  VertexPacket *packet;
  undefined8 local_18;
  size_t poolSize;
  VertexPacketAllocator *this_local;
  
  local_18 = 8;
  poolSize = (size_t)this;
  bVar1 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::empty
                    (&this->m_singleAllocPool);
  if (bVar1) {
    allocArray((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&packet,this,8);
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::operator=
              (&this->m_singleAllocPool,
               (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&packet);
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~vector
              ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&packet);
  }
  local_40._M_current =
       (VertexPacket **)
       std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::end
                 (&this->m_singleAllocPool);
  this_00 = __gnu_cxx::
            __normal_iterator<rr::VertexPacket_**,_std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>_>
            ::operator--(&local_40);
  ppVVar2 = __gnu_cxx::
            __normal_iterator<rr::VertexPacket_**,_std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>_>
            ::operator*(this_00);
  local_38 = *ppVVar2;
  std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::pop_back
            (&this->m_singleAllocPool);
  return local_38;
}

Assistant:

VertexPacket* VertexPacketAllocator::alloc (void)
{
	const size_t poolSize = 8;

	if (m_singleAllocPool.empty())
		m_singleAllocPool = allocArray(poolSize);

	VertexPacket* packet = *--m_singleAllocPool.end();
	m_singleAllocPool.pop_back();
	return packet;
}